

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

State __thiscall QSpinBoxValidator::validate(QSpinBoxValidator *this,QString *input,int *pos)

{
  long *plVar1;
  bool bVar2;
  qsizetype qVar3;
  ulong uVar4;
  QString *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  State local_4;
  
  qVar3 = QString::size((QString *)&in_RDI[1].d.d[0x28].super_QArrayData.alloc);
  if ((qVar3 < 1) || (bVar2 = ::operator==(in_RDX,in_RDI), !bVar2)) {
    bVar2 = QString::isEmpty((QString *)0x68c3c6);
    if ((!bVar2) && (uVar4 = QString::startsWith(in_RSI,(int)in_RDI[1].d.d + 600), (uVar4 & 1) == 0)
       ) {
      QString::prepend(in_RDX,in_RDI);
      qVar3 = QString::size((QString *)&in_RDI[1].d.d[0x25].super_QArrayData.alloc);
      *(int *)&(in_RDX->d).d = *(int *)&(in_RDX->d).d + (int)qVar3;
    }
    bVar2 = QString::isEmpty((QString *)0x68c43d);
    if ((!bVar2) && (uVar4 = QString::endsWith(in_RSI,(int)in_RDI[1].d.d + 0x270), (uVar4 & 1) == 0)
       ) {
      QString::append(in_RSI);
    }
    plVar1 = (long *)(in_RDI->d).size;
    local_4 = (**(code **)(*plVar1 + 0x1a0))(plVar1,in_RSI,in_RDX);
  }
  else {
    local_4 = Acceptable;
  }
  return local_4;
}

Assistant:

QValidator::State QSpinBoxValidator::validate(QString &input, int &pos) const
{
    if (dptr->specialValueText.size() > 0 && input == dptr->specialValueText)
        return QValidator::Acceptable;

    if (!dptr->prefix.isEmpty() && !input.startsWith(dptr->prefix)) {
        input.prepend(dptr->prefix);
        pos += dptr->prefix.size();
    }

    if (!dptr->suffix.isEmpty() && !input.endsWith(dptr->suffix))
        input.append(dptr->suffix);

    return qptr->validate(input, pos);
}